

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

_Bool array_container_contains_range(array_container_t *arr,uint32_t range_start,uint32_t range_end)

{
  int iVar1;
  int32_t iVar2;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int32_t start;
  uint16_t re_included;
  uint16_t rs_included;
  int32_t range_count;
  _Bool local_25;
  _Bool local_1;
  
  iVar1 = in_EDX - in_ESI;
  if (iVar1 < 1) {
    local_1 = true;
  }
  else if (*in_RDI < iVar1) {
    local_1 = false;
  }
  else {
    iVar2 = binarySearch(*(uint16_t **)(in_RDI + 2),*in_RDI,(uint16_t)in_ESI);
    local_25 = false;
    if ((-1 < iVar2) && (local_25 = false, iVar2 + iVar1 <= *in_RDI)) {
      local_25 = *(short *)(*(long *)(in_RDI + 2) + (long)(iVar2 + iVar1 + -1) * 2) ==
                 (short)((short)in_EDX + -1);
    }
    local_1 = local_25;
  }
  return local_1;
}

Assistant:

static inline bool array_container_contains_range(const array_container_t *arr,
                                                  uint32_t range_start,
                                                  uint32_t range_end) {
    const int32_t range_count = range_end - range_start;
    const uint16_t rs_included = (uint16_t)range_start;
    const uint16_t re_included = (uint16_t)(range_end - 1);

    // Empty range is always included
    if (range_count <= 0) {
        return true;
    }
    if (range_count > arr->cardinality) {
        return false;
    }

    const int32_t start =
        binarySearch(arr->array, arr->cardinality, rs_included);
    // If this sorted array contains all items in the range:
    // * the start item must be found
    // * the last item in range range_count must exist, and be the expected end
    // value
    return (start >= 0) && (arr->cardinality >= start + range_count) &&
           (arr->array[start + range_count - 1] == re_included);
}